

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O1

void __thiscall
glslang::HlslParseContext::correctInput(HlslParseContext *this,TQualifier *qualifier)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  ulong uVar4;
  
  uVar1 = *(ulong *)&qualifier->field_0x8;
  uVar2 = *(ulong *)&qualifier->field_0x24;
  *(ulong *)&qualifier->field_0x8 = uVar1 & 0x1fffffffffffffff;
  qualifier->field_0x10 = qualifier->field_0x10 & 0xf0;
  qualifier->layoutOffset = -1;
  qualifier->layoutAlign = -1;
  uVar4 = *(ulong *)&qualifier->field_0x1c & 0xffff0000ffc07fff;
  *(ulong *)&qualifier->field_0x1c = uVar4 | 0xffff001f8000;
  *(ulong *)&qualifier->field_0x24 = uVar2 | 0xff00000000;
  qualifier->layoutPushConstant = false;
  if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangVertex) {
    *(ulong *)&qualifier->field_0x8 = uVar1 & 0x1fffc01f1fffffff;
  }
  if ((this->super_TParseContextBase).super_TParseVersions.language != EShLangTessEvaluation) {
    qualifier->field_0xd = qualifier->field_0xd & 0xef;
  }
  if ((this->super_TParseContextBase).super_TParseVersions.language != EShLangFragment) {
    *(ulong *)&qualifier->field_0x8 = *(ulong *)&qualifier->field_0x8 & 0xffffd01f1fffffff;
  }
  *(ulong *)&qualifier->field_0x1c = uVar4 | 0xff00ffff001f8000;
  *(ulong *)&qualifier->field_0x24 = uVar2 | 0xff7fffffff;
  bVar3 = isInputBuiltIn(this,qualifier);
  if (!bVar3) {
    *(ushort *)&qualifier->field_0x8 = *(ushort *)&qualifier->field_0x8 & 0x7f;
  }
  return;
}

Assistant:

void HlslParseContext::correctInput(TQualifier& qualifier)
{
    clearUniform(qualifier);
    if (language == EShLangVertex)
        qualifier.clearInterstage();
    if (language != EShLangTessEvaluation)
        qualifier.patch = false;
    if (language != EShLangFragment) {
        qualifier.clearInterpolation();
        qualifier.sample = false;
    }

    qualifier.clearStreamLayout();
    qualifier.clearXfbLayout();

    if (! isInputBuiltIn(qualifier))
        qualifier.builtIn = EbvNone;
}